

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall Lowerer::LowerStArrViewElem(Lowerer *this,Instr *instr)

{
  uint offset;
  Instr *pIVar1;
  Opnd *this_00;
  Opnd *src1;
  Opnd *src2;
  Opnd *indexOpnd;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  JITTimeFunctionBody *pJVar5;
  undefined4 *puVar6;
  Instr *insertBeforeInstr;
  AsmJsJITInfo *this_01;
  Lowerer *in_stack_ffffffffffffffa0;
  
  pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar3 = JITTimeFunctionBody::IsAsmJsMode(pJVar5);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2668,"(m_func->GetJITFunctionBody()->IsAsmJsMode())",
                       "m_func->GetJITFunctionBody()->IsAsmJsMode()");
    if (!bVar3) goto LAB_005b36cc;
    *puVar6 = 0;
  }
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2669,"(instr)","instr");
    if (!bVar3) goto LAB_005b36cc;
    *puVar6 = 0;
  }
  if (instr->m_opcode != StArrViewElem) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x266a,"(instr->m_opcode == Js::OpCode::StArrViewElem)",
                       "instr->m_opcode == Js::OpCode::StArrViewElem");
    if (!bVar3) goto LAB_005b36cc;
    *puVar6 = 0;
  }
  pIVar1 = instr->m_prev;
  this_00 = instr->m_dst;
  src1 = instr->m_src1;
  src2 = instr->m_src2;
  OVar4 = IR::Opnd::GetKind(this_00);
  if (OVar4 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar3) goto LAB_005b36cc;
    *puVar6 = 0;
  }
  indexOpnd = *(Opnd **)&this_00[1].m_valueType;
  OVar4 = IR::Opnd::GetKind(this_00);
  if (OVar4 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar3) goto LAB_005b36cc;
    *puVar6 = 0;
  }
  offset = *(uint *)&this_00[2]._vptr_Opnd;
  if ((this_00->m_type == TyFloat32) && (src1->m_type != TyFloat32)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2676,"(!dst->IsFloat32() || src1->IsFloat32())",
                       "!dst->IsFloat32() || src1->IsFloat32()");
    if (!bVar3) goto LAB_005b36cc;
    *puVar6 = 0;
  }
  if ((this_00->m_type == TyFloat64) && (src1->m_type != TyFloat64)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2677,"(!dst->IsFloat64() || src1->IsFloat64())",
                       "!dst->IsFloat64() || src1->IsFloat64()");
    if (!bVar3) goto LAB_005b36cc;
    *puVar6 = 0;
  }
  bVar3 = IRType_IsInt64(this_00->m_type);
  if ((bVar3) && (bVar3 = IRType_IsInt64(src1->m_type), !bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2678,"(!dst->IsInt64() || src1->IsInt64())",
                       "!dst->IsInt64() || src1->IsInt64()");
    if (!bVar3) {
LAB_005b36cc:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar3 = JITTimeFunctionBody::IsWasmFunction(pJVar5);
  if (bVar3) {
    insertBeforeInstr = LowerWasmArrayBoundsCheck(this,instr,this_00);
  }
  else {
    if ((int)offset < 0) goto LAB_005b3688;
    if (indexOpnd == (Opnd *)0x0) {
      pJVar5 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      this_01 = JITTimeFunctionBody::GetAsmJsInfo(pJVar5);
      bVar3 = AsmJsJITInfo::AccessNeedsBoundCheck(this_01,offset);
      if (!bVar3) {
        IR::Instr::UnlinkDst(instr);
        IR::Instr::UnlinkSrc1(instr);
        insertBeforeInstr = instr;
        if (src2 != (Opnd *)0x0) {
          IR::Instr::FreeSrc2(instr);
        }
        goto LAB_005b366b;
      }
    }
    insertBeforeInstr = LowererMD::LowerAsmJsStElemHelper(&this->m_lowererMD,instr);
  }
LAB_005b366b:
  InsertMaskableMove(true,false,this_00,src1,src2,indexOpnd,insertBeforeInstr,
                     in_stack_ffffffffffffffa0);
LAB_005b3688:
  IR::Instr::Remove(instr);
  return pIVar1;
}

Assistant:

IR::Instr *
Lowerer::LowerStArrViewElem(IR::Instr * instr)
{
#ifdef ASMJS_PLAT
    Assert(m_func->GetJITFunctionBody()->IsAsmJsMode());
    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::StArrViewElem);

    IR::Instr * instrPrev = instr->m_prev;

    IR::Opnd * dst = instr->GetDst();
    IR::Opnd * src1 = instr->GetSrc1();
    IR::Opnd * src2 = instr->GetSrc2();

    // type of dst is the type of array
    IR::RegOpnd * indexOpnd = dst->AsIndirOpnd()->GetIndexOpnd();
    int32 offset = dst->AsIndirOpnd()->GetOffset();

    Assert(!dst->IsFloat32() || src1->IsFloat32());
    Assert(!dst->IsFloat64() || src1->IsFloat64());
    Assert(!dst->IsInt64() || src1->IsInt64());

    IR::Instr * done;

    if (m_func->GetJITFunctionBody()->IsWasmFunction())
    {
        done = LowerWasmArrayBoundsCheck(instr, dst);
    }
    else if (offset < 0)
    {
        instr->Remove();
        return instrPrev;
    }
    else if (indexOpnd || m_func->GetJITFunctionBody()->GetAsmJsInfo()->AccessNeedsBoundCheck((uint32)offset))
    {
        // CMP indexOpnd, src2(arrSize)
        // JA $helper
        // JMP $store
        // $helper:
        // JMP $done
        // $store:
        // MOV dst([arrayBuffer + indexOpnd]), src1
        // $done:
        done = m_lowererMD.LowerAsmJsStElemHelper(instr);
    }
    else
    {
        // any constant access below 0x10000 is safe, as that is the min heap size
        instr->UnlinkDst();
        instr->UnlinkSrc1();
        done = instr;
        if (src2)
        {
            instr->FreeSrc2();
        }
    }
    // wasm memory buffer is not recycler allocated, so we shouldn't generate write barrier
    InsertMaskableMove(true, false, dst, src1, src2, indexOpnd, done, this);

    instr->Remove();
    return instrPrev;
#else
    Assert(UNREACHED);
    return instr;
#endif
}